

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_3> * __thiscall
tcu::normalize<double,3>(Vector<double,_3> *__return_storage_ptr__,tcu *this,Vector<double,_3> *a)

{
  int i;
  long lVar1;
  double sqSum;
  double dVar2;
  
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar2 = dVar2 + *(double *)(this + lVar1 * 8) * *(double *)(this + lVar1 * 8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (dVar2 < 0.0) {
    dVar2 = ::sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  lVar1 = 0;
  do {
    __return_storage_ptr__->m_data[lVar1] = *(double *)(this + lVar1 * 8) * (1.0 / dVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}